

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O1

int loader_impl_handle_register
              (plugin_manager manager,loader_impl impl,char *path,loader_handle_impl handle_impl,
              void **handle_ptr)

{
  bool bVar1;
  int iVar2;
  size_t line;
  char *message;
  loader_handle_impl target_handle;
  char *local_30;
  char *duplicated_key;
  
  if (handle_ptr == (void **)0x0) {
    target_handle = (loader_handle_impl)handle_impl->ctx;
    local_30 = (char *)0x0;
    plugin_manager_iterate(manager,loader_impl_handle_register_cb_iterate,&target_handle);
    if (local_30 == (char *)0x0) {
      iVar2 = context_append(impl->ctx,handle_impl->ctx);
      if (iVar2 != 0) goto LAB_0012372c;
      iVar2 = 0;
      goto LAB_00123742;
    }
    message = 
    "Duplicated symbol found named \'%s\' already defined in the global scope by handle: %s";
    line = 0x31b;
    duplicated_key = local_30;
  }
  else {
    target_handle = (loader_handle_impl)*handle_ptr;
    if (target_handle == (loader_handle_impl)0x0) {
      iVar2 = loader_impl_handle_init(impl,path,handle_impl,handle_ptr,1);
      return iVar2;
    }
    iVar2 = context_contains(handle_impl->ctx,target_handle->ctx,&duplicated_key);
    if (duplicated_key == (char *)0x0 || iVar2 != 0) {
      iVar2 = context_append(target_handle->ctx,handle_impl->ctx);
      if (iVar2 != 0) {
LAB_0012372c:
        bVar1 = true;
        goto LAB_00123747;
      }
      vector_push_back(handle_impl->populated_handles,&target_handle);
      iVar2 = 1;
LAB_00123742:
      bVar1 = false;
      iVar2 = loader_impl_handle_init(impl,path,handle_impl,(void **)0x0,iVar2);
      goto LAB_00123747;
    }
    message = 
    "Duplicated symbol found named \'%s\' already defined in the handle scope by handle: %s";
    line = 0x32d;
  }
  bVar1 = false;
  log_write_impl_va("metacall",line,"loader_impl_handle_register",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loader/source/loader_impl.c"
                    ,LOG_LEVEL_ERROR,message,duplicated_key,path);
  iVar2 = 1;
LAB_00123747:
  if (bVar1) {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int loader_impl_handle_register(plugin_manager manager, loader_impl impl, const char *path, loader_handle_impl handle_impl, void **handle_ptr)
{
	/* If there's no handle input/output pointer passed as input parameter, then propagate the handle symbols to the loader context */
	if (handle_ptr == NULL)
	{
		/* This case handles the global scope (shared scope between all loaders, there is no out reference to a handle) */
		struct loader_impl_handle_register_cb_iterator_type iterator;

		iterator.handle_ctx = handle_impl->ctx;
		iterator.duplicated_key = NULL;

		/* This checks if there are duplicated keys between all loaders and the current handle context */
		plugin_manager_iterate(manager, &loader_impl_handle_register_cb_iterate, &iterator);

		if (iterator.duplicated_key != NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the global scope by handle: %s", iterator.duplicated_key, path);
			return 1;
		}
		else if (context_append(impl->ctx, handle_impl->ctx) == 0)
		{
			return loader_impl_handle_init(impl, path, handle_impl, handle_ptr, 0);
		}
	}
	else
	{
		/* Otherwise, if there's a handle pointer and it is different from NULL, it means we are passing a handle as input parameter, so propagate symbols to this handle */
		if (*handle_ptr != NULL)
		{
			loader_handle_impl target_handle = (loader_handle_impl)*handle_ptr;
			char *duplicated_key;

			if (context_contains(handle_impl->ctx, target_handle->ctx, &duplicated_key) == 0 && duplicated_key != NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Duplicated symbol found named '%s' already defined in the handle scope by handle: %s", duplicated_key, path);
				return 1;
			}
			else if (context_append(target_handle->ctx, handle_impl->ctx) == 0)
			{
				vector_push_back_var(handle_impl->populated_handles, target_handle);

				return loader_impl_handle_init(impl, path, handle_impl, NULL, 1);
			}
		}
		else
		{
			/* Otherwise, initialize the handle and do not propagate the symbols, keep it private to the handle instance */
			return loader_impl_handle_init(impl, path, handle_impl, handle_ptr, 1);
		}
	}

	return 1;
}